

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::V1LayerParameter::InternalSwap(V1LayerParameter *this,V1LayerParameter *other)

{
  InternalMetadataWithArena *this_00;
  V1LayerParameter *other_local;
  V1LayerParameter *this_local;
  Container *local_30;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->bottom_).super_RepeatedPtrFieldBase,
             &(other->bottom_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->top_).super_RepeatedPtrFieldBase,&(other->top_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(other->blobs_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::RepeatedField<float>::InternalSwap(&this->blobs_lr_,&other->blobs_lr_);
  google::protobuf::RepeatedField<float>::InternalSwap(&this->weight_decay_,&other->weight_decay_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->include_).super_RepeatedPtrFieldBase,
             &(other->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->exclude_).super_RepeatedPtrFieldBase,
             &(other->exclude_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<float>::InternalSwap(&this->loss_weight_,&other->loss_weight_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->param_).super_RepeatedPtrFieldBase,&(other->param_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::RepeatedField<int>::InternalSwap
            (&this->blob_share_mode_,&other->blob_share_mode_);
  std::swap<std::__cxx11::string*>(&(this->name_).ptr_,&(other->name_).ptr_);
  std::swap<caffe::V0LayerParameter*>(&this->layer_,&other->layer_);
  std::swap<caffe::ConcatParameter*>(&this->concat_param_,&other->concat_param_);
  std::swap<caffe::ConvolutionParameter*>(&this->convolution_param_,&other->convolution_param_);
  std::swap<caffe::DataParameter*>(&this->data_param_,&other->data_param_);
  std::swap<caffe::DropoutParameter*>(&this->dropout_param_,&other->dropout_param_);
  std::swap<caffe::HDF5DataParameter*>(&this->hdf5_data_param_,&other->hdf5_data_param_);
  std::swap<caffe::HDF5OutputParameter*>(&this->hdf5_output_param_,&other->hdf5_output_param_);
  std::swap<caffe::ImageDataParameter*>(&this->image_data_param_,&other->image_data_param_);
  std::swap<caffe::InfogainLossParameter*>(&this->infogain_loss_param_,&other->infogain_loss_param_)
  ;
  std::swap<caffe::InnerProductParameter*>(&this->inner_product_param_,&other->inner_product_param_)
  ;
  std::swap<caffe::LRNParameter*>(&this->lrn_param_,&other->lrn_param_);
  std::swap<caffe::PoolingParameter*>(&this->pooling_param_,&other->pooling_param_);
  std::swap<caffe::WindowDataParameter*>(&this->window_data_param_,&other->window_data_param_);
  std::swap<caffe::PowerParameter*>(&this->power_param_,&other->power_param_);
  std::swap<caffe::MemoryDataParameter*>(&this->memory_data_param_,&other->memory_data_param_);
  std::swap<caffe::ArgMaxParameter*>(&this->argmax_param_,&other->argmax_param_);
  std::swap<caffe::EltwiseParameter*>(&this->eltwise_param_,&other->eltwise_param_);
  std::swap<caffe::ThresholdParameter*>(&this->threshold_param_,&other->threshold_param_);
  std::swap<caffe::DummyDataParameter*>(&this->dummy_data_param_,&other->dummy_data_param_);
  std::swap<caffe::AccuracyParameter*>(&this->accuracy_param_,&other->accuracy_param_);
  std::swap<caffe::HingeLossParameter*>(&this->hinge_loss_param_,&other->hinge_loss_param_);
  std::swap<caffe::ReLUParameter*>(&this->relu_param_,&other->relu_param_);
  std::swap<caffe::SliceParameter*>(&this->slice_param_,&other->slice_param_);
  std::swap<caffe::MVNParameter*>(&this->mvn_param_,&other->mvn_param_);
  std::swap<caffe::TransformationParameter*>(&this->transform_param_,&other->transform_param_);
  std::swap<caffe::TanHParameter*>(&this->tanh_param_,&other->tanh_param_);
  std::swap<caffe::SigmoidParameter*>(&this->sigmoid_param_,&other->sigmoid_param_);
  std::swap<caffe::SoftmaxParameter*>(&this->softmax_param_,&other->softmax_param_);
  std::swap<caffe::ContrastiveLossParameter*>
            (&this->contrastive_loss_param_,&other->contrastive_loss_param_);
  std::swap<caffe::ExpParameter*>(&this->exp_param_,&other->exp_param_);
  std::swap<caffe::LossParameter*>(&this->loss_param_,&other->loss_param_);
  std::swap<int>(&this->type_,&other->type_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_ + 1,(other->_has_bits_).has_bits_ + 1);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_007b7302;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap
            (&this->_internal_metadata_,&local_30->unknown_fields);
LAB_007b7302:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void V1LayerParameter::InternalSwap(V1LayerParameter* other) {
  bottom_.InternalSwap(&other->bottom_);
  top_.InternalSwap(&other->top_);
  blobs_.InternalSwap(&other->blobs_);
  blobs_lr_.InternalSwap(&other->blobs_lr_);
  weight_decay_.InternalSwap(&other->weight_decay_);
  include_.InternalSwap(&other->include_);
  exclude_.InternalSwap(&other->exclude_);
  loss_weight_.InternalSwap(&other->loss_weight_);
  param_.InternalSwap(&other->param_);
  blob_share_mode_.InternalSwap(&other->blob_share_mode_);
  name_.Swap(&other->name_);
  std::swap(layer_, other->layer_);
  std::swap(concat_param_, other->concat_param_);
  std::swap(convolution_param_, other->convolution_param_);
  std::swap(data_param_, other->data_param_);
  std::swap(dropout_param_, other->dropout_param_);
  std::swap(hdf5_data_param_, other->hdf5_data_param_);
  std::swap(hdf5_output_param_, other->hdf5_output_param_);
  std::swap(image_data_param_, other->image_data_param_);
  std::swap(infogain_loss_param_, other->infogain_loss_param_);
  std::swap(inner_product_param_, other->inner_product_param_);
  std::swap(lrn_param_, other->lrn_param_);
  std::swap(pooling_param_, other->pooling_param_);
  std::swap(window_data_param_, other->window_data_param_);
  std::swap(power_param_, other->power_param_);
  std::swap(memory_data_param_, other->memory_data_param_);
  std::swap(argmax_param_, other->argmax_param_);
  std::swap(eltwise_param_, other->eltwise_param_);
  std::swap(threshold_param_, other->threshold_param_);
  std::swap(dummy_data_param_, other->dummy_data_param_);
  std::swap(accuracy_param_, other->accuracy_param_);
  std::swap(hinge_loss_param_, other->hinge_loss_param_);
  std::swap(relu_param_, other->relu_param_);
  std::swap(slice_param_, other->slice_param_);
  std::swap(mvn_param_, other->mvn_param_);
  std::swap(transform_param_, other->transform_param_);
  std::swap(tanh_param_, other->tanh_param_);
  std::swap(sigmoid_param_, other->sigmoid_param_);
  std::swap(softmax_param_, other->softmax_param_);
  std::swap(contrastive_loss_param_, other->contrastive_loss_param_);
  std::swap(exp_param_, other->exp_param_);
  std::swap(loss_param_, other->loss_param_);
  std::swap(type_, other->type_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  std::swap(_has_bits_[1], other->_has_bits_[1]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}